

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writefile_test.cpp
# Opt level: O0

int main(void)

{
  char *pcVar1;
  size_t sVar2;
  __cxx11 a_Stack_100a0 [8];
  string sId;
  int iStack_10080;
  int iStack_1007c;
  int i_1;
  int i;
  string str;
  allocator aStack_10041;
  string asStack_10040 [32];
  undefined1 auStack_10020 [8];
  WriteFile write;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_10040,"./temp.log",&aStack_10041);
  WriteFile::WriteFile((WriteFile *)auStack_10020,(string *)asStack_10040);
  std::__cxx11::string::~string(asStack_10040);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_10041);
  std::__cxx11::string::string((string *)&i_1);
  for (iStack_1007c = 0; iStack_1007c < 0x1a; iStack_1007c = iStack_1007c + 1) {
    std::__cxx11::string::push_back((char)&i_1);
  }
  for (iStack_10080 = 0; iStack_10080 < 10000; iStack_10080 = iStack_10080 + 1) {
    std::__cxx11::to_string(a_Stack_100a0,iStack_10080);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    sVar2 = std::__cxx11::string::size();
    WriteFile::Append((WriteFile *)auStack_10020,pcVar1,sVar2);
    WriteFile::Append((WriteFile *)auStack_10020," : ",3);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    sVar2 = std::__cxx11::string::size();
    WriteFile::Append((WriteFile *)auStack_10020,pcVar1,sVar2);
    WriteFile::Append((WriteFile *)auStack_10020,"\n",1);
    std::__cxx11::string::~string((string *)a_Stack_100a0);
  }
  WriteFile::Sync((WriteFile *)auStack_10020);
  std::__cxx11::string::~string((string *)&i_1);
  WriteFile::~WriteFile((WriteFile *)auStack_10020);
  return 0;
}

Assistant:

int main()
{
	WriteFile write("./temp.log");
	
	string str;
	for (int i = 0; i < 26; ++i)
	{
		str.push_back('a' + i);
	}
	
	for (int i = 0; i < 10000; ++i)
	{
		string sId = to_string(i);
		write.Append(sId.c_str(), sId.size());
		write.Append(" : ", 3);
		write.Append(str.c_str(), str.size());
		write.Append("\n", 1);
	}
	
	write.Sync();
}